

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

DescriptorProto_ReservedRange *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
          (Arena *arena)

{
  DescriptorProto_ReservedRange *pDVar1;
  
  if (arena == (Arena *)0x0) {
    pDVar1 = (DescriptorProto_ReservedRange *)operator_new(0x20);
    (pDVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__DescriptorProto_ReservedRange_00682500;
    (pDVar1->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = (void *)0x0;
    pDVar1->_has_bits_ = (uint32  [1])0x0;
    pDVar1->_cached_size_ = (atomic<int>)0x0;
    pDVar1->start_ = 0;
    pDVar1->end_ = 0;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&DescriptorProto_ReservedRange::typeinfo,0x20);
    }
    pDVar1 = (DescriptorProto_ReservedRange *)
             internal::ArenaImpl::AllocateAligned(&arena->impl_,0x20);
    (pDVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__DescriptorProto_ReservedRange_00682500;
    (pDVar1->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = arena;
    pDVar1->_has_bits_ = (uint32  [1])0x0;
    pDVar1->_cached_size_ = (atomic<int>)0x0;
    pDVar1->start_ = 0;
    pDVar1->end_ = 0;
  }
  return pDVar1;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}